

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcElementQuantity::~IfcElementQuantity(IfcElementQuantity *this)

{
  pointer pLVar1;
  undefined1 *puVar2;
  pointer pcVar3;
  
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x9ad588;
  *(undefined8 *)&this->field_0xf8 = 0x9ad628;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x88 =
       0x9ad5b0;
  *(undefined8 *)
   &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.field_0x98 =
       0x9ad5d8;
  *(undefined8 *)&(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.field_0xa8 =
       0x9ad600;
  pLVar1 = (this->Quantities).
           super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           .
           super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pLVar1 != (pointer)0x0) {
    operator_delete(pLVar1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcPropertySetDefinition).field_0xb8;
  if (puVar2 != &this->field_0xc8) {
    operator_delete(puVar2);
  }
  (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x9ad818;
  *(undefined8 *)&this->field_0xf8 = 0x9ad840;
  pcVar3 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
           Description.ptr._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 !=
      &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Description.
       ptr.field_2) {
    operator_delete(pcVar3);
  }
  pcVar3 = (this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr
           ._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 !=
      &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.Name.ptr.
       field_2) {
    operator_delete(pcVar3);
  }
  puVar2 = *(undefined1 **)
            &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x10;
  if (puVar2 != &(this->super_IfcPropertySetDefinition).super_IfcPropertyDefinition.super_IfcRoot.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRoot,_4UL>.field_0x20) {
    operator_delete(puVar2);
    return;
  }
  return;
}

Assistant:

IfcElementQuantity() : Object("IfcElementQuantity") {}